

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_Header(archive_read *a,_7z_header_info *h,int check_header_id)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint32_t uVar6;
  uchar *puVar7;
  void *pvVar8;
  byte *pbVar9;
  uchar *__src;
  archive_read *a_00;
  long lVar10;
  long *plVar11;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  bool bVar12;
  int dir;
  int allAreDefined;
  size_t b;
  size_t nb;
  size_t nl;
  uchar *np;
  size_t ll;
  uint64_t size_1;
  int type;
  uint64_t size;
  int sindex;
  int empty_streams;
  int eindex;
  uint i;
  uint32_t indexInFolder;
  uint32_t folderIndex;
  _7zip_entry *entries;
  _7z_stream_info *si;
  _7z_folder *folders;
  uchar *p;
  _7zip *zip;
  uint64_t *in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  archive_read *in_stack_ffffffffffffff60;
  archive_read *in_stack_ffffffffffffff68;
  _7z_stream_info *in_stack_ffffffffffffff70;
  archive_read *paVar13;
  archive_read *in_stack_ffffffffffffff78;
  archive_read *in_stack_ffffffffffffff88;
  archive_read *paVar14;
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uchar *local_30;
  int local_4;
  
  lVar2 = **(long **)(in_RDI + 0x948);
  if (in_EDX != 0) {
    puVar7 = header_bytes(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
    if (puVar7 == (uchar *)0x0) {
      return -1;
    }
    if (*puVar7 != '\x01') {
      return -1;
    }
  }
  local_30 = header_bytes(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
  if (local_30 == (uchar *)0x0) {
    local_4 = -1;
  }
  else if (*local_30 == '\x02') {
    do {
      puVar7 = header_bytes(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
      if (puVar7 == (uchar *)0x0) {
        return -1;
      }
      if (*puVar7 == '\0') {
        local_30 = header_bytes(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
        if (local_30 == (uchar *)0x0) {
          return -1;
        }
        goto LAB_00248ca4;
      }
      iVar5 = parse_7zip_uint64((archive_read *)
                                CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                in_stack_ffffffffffffff50);
    } while (-1 < iVar5);
    local_4 = -1;
  }
  else {
LAB_00248ca4:
    if (*local_30 == '\x04') {
      iVar5 = read_StreamsInfo(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      if (iVar5 < 0) {
        return -1;
      }
      local_30 = header_bytes(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
      if (local_30 == (uchar *)0x0) {
        return -1;
      }
    }
    if (*local_30 == '\0') {
      local_4 = 0;
    }
    else if (*local_30 == '\x05') {
      iVar5 = parse_7zip_uint64((archive_read *)
                                CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                in_stack_ffffffffffffff50);
      if (iVar5 < 0) {
        local_4 = -1;
      }
      else if (*(ulong *)(lVar2 + 0x98) < 0xf4241) {
        pvVar8 = calloc(*(size_t *)(lVar2 + 0x98),0x58);
        *(void **)(lVar2 + 0xa0) = pvVar8;
        if (*(long *)(lVar2 + 0xa0) == 0) {
          local_4 = -1;
        }
        else {
          lVar3 = *(long *)(lVar2 + 0xa0);
          local_5c = 0;
LAB_00248e10:
          do {
            pbVar9 = header_bytes(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
            if (pbVar9 == (byte *)0x0) {
              return -1;
            }
            bVar1 = *pbVar9;
            if (bVar1 == 0) {
              lVar4 = *(long *)(lVar2 + 0x38);
              local_60 = 0;
              local_58 = 0;
              local_50 = 0;
              local_4c = 0;
              local_54 = 0;
              do {
                if (*(ulong *)(lVar2 + 0x98) <= (ulong)local_54) {
                  return 0;
                }
                if ((*(long *)(in_RSI + 8) == 0) ||
                   (*(char *)(*(long *)(in_RSI + 8) + (ulong)local_54) == '\0')) {
                  lVar10 = lVar3 + (ulong)local_54 * 0x58;
                  *(uint *)(lVar10 + 0x18) = *(uint *)(lVar10 + 0x18) | 0x10;
                }
                *(uint *)(lVar3 + (ulong)local_54 * 0x58 + 0x50) =
                     *(uint *)(lVar3 + (ulong)local_54 * 0x58 + 0x54) >> 0x10;
                if ((*(uint *)(lVar3 + (ulong)local_54 * 0x58 + 0x18) & 0x10) == 0) {
                  if (*(long *)(in_RSI + 0x10) == 0) {
                    bVar12 = true;
                  }
                  else {
                    bVar12 = *(char *)(*(long *)(in_RSI + 0x10) + (long)local_58) == '\0';
                    local_58 = local_58 + 1;
                  }
                  if (*(int *)(lVar3 + (ulong)local_54 * 0x58 + 0x50) == 0) {
                    if (bVar12) {
                      *(undefined4 *)(lVar3 + (ulong)local_54 * 0x58 + 0x50) = 0x41ff;
                    }
                    else {
                      *(undefined4 *)(lVar3 + (ulong)local_54 * 0x58 + 0x50) = 0x81b6;
                    }
                  }
                  else if ((bVar12) &&
                          ((*(uint *)(lVar3 + (ulong)local_54 * 0x58 + 0x50) & 0xf000) != 0x4000)) {
                    lVar10 = lVar3 + (ulong)local_54 * 0x58;
                    *(uint *)(lVar10 + 0x50) = *(uint *)(lVar10 + 0x50) & 0xffff0fff;
                    lVar10 = lVar3 + (ulong)local_54 * 0x58;
                    *(uint *)(lVar10 + 0x50) = *(uint *)(lVar10 + 0x50) | 0x4000;
                  }
                  if ((((*(uint *)(lVar3 + (ulong)local_54 * 0x58 + 0x50) & 0xf000) == 0x4000) &&
                      (1 < *(ulong *)(lVar3 + (ulong)local_54 * 0x58))) &&
                     ((*(char *)(*(long *)(lVar3 + (ulong)local_54 * 0x58 + 8) +
                                *(long *)(lVar3 + (ulong)local_54 * 0x58) + -2) != '/' ||
                      (*(char *)(*(long *)(lVar3 + (ulong)local_54 * 0x58 + 8) +
                                *(long *)(lVar3 + (ulong)local_54 * 0x58) + -1) != '\0')))) {
                    *(undefined1 *)
                     (*(long *)(lVar3 + (ulong)local_54 * 0x58 + 8) +
                     *(long *)(lVar3 + (ulong)local_54 * 0x58)) = 0x2f;
                    *(undefined1 *)
                     (*(long *)(lVar3 + (ulong)local_54 * 0x58 + 8) + 1 +
                     *(long *)(lVar3 + (ulong)local_54 * 0x58)) = 0;
                    plVar11 = (long *)(lVar3 + (ulong)local_54 * 0x58);
                    *plVar11 = *plVar11 + 2;
                  }
                  *(undefined4 *)(lVar3 + (ulong)local_54 * 0x58 + 0x14) = 0xffffffff;
                }
                else {
                  if (*(ulong *)(lVar2 + 0x48) <= (ulong)(long)local_60) {
                    return -1;
                  }
                  if (*(int *)(lVar3 + (ulong)local_54 * 0x58 + 0x50) == 0) {
                    *(undefined4 *)(lVar3 + (ulong)local_54 * 0x58 + 0x50) = 0x81b6;
                  }
                  if (*(char *)(*(long *)(lVar2 + 0x58) + (long)local_60) != '\0') {
                    lVar10 = lVar3 + (ulong)local_54 * 0x58;
                    *(uint *)(lVar10 + 0x18) = *(uint *)(lVar10 + 0x18) | 8;
                  }
                  *(int *)(lVar3 + (ulong)local_54 * 0x58 + 0x14) = local_60;
                  local_60 = local_60 + 1;
                }
                if ((*(uint *)(lVar3 + (ulong)local_54 * 0x58 + 0x54) & 1) != 0) {
                  lVar10 = lVar3 + (ulong)local_54 * 0x58;
                  *(uint *)(lVar10 + 0x50) = *(uint *)(lVar10 + 0x50) & 0xffffff6d;
                }
                if (((*(uint *)(lVar3 + (ulong)local_54 * 0x58 + 0x18) & 0x10) == 0) &&
                   (local_50 == 0)) {
                  *(undefined4 *)(lVar3 + (ulong)local_54 * 0x58 + 0x10) = 0xffffffff;
                }
                else {
                  if (local_50 == 0) {
                    while( true ) {
                      if (*(ulong *)(lVar2 + 0x30) <= (ulong)local_4c) {
                        return -1;
                      }
                      if (*(long *)(lVar4 + (ulong)local_4c * 0x68 + 0x50) != 0) break;
                      local_4c = local_4c + 1;
                    }
                  }
                  *(uint *)(lVar3 + (ulong)local_54 * 0x58 + 0x10) = local_4c;
                  if (((*(uint *)(lVar3 + (ulong)local_54 * 0x58 + 0x18) & 0x10) != 0) &&
                     (local_50 = local_50 + 1,
                     *(ulong *)(lVar4 + (ulong)local_4c * 0x68 + 0x50) <= (ulong)local_50)) {
                    local_4c = local_4c + 1;
                    local_50 = 0;
                  }
                }
                local_54 = local_54 + 1;
              } while( true );
            }
            iVar5 = parse_7zip_uint64((archive_read *)
                                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                      in_stack_ffffffffffffff50);
            if (iVar5 < 0) {
              return -1;
            }
            if (*(archive_read **)(lVar2 + 0x70) < in_stack_ffffffffffffff88) {
              return -1;
            }
            in_stack_ffffffffffffff50 = (uint64_t *)(ulong)(bVar1 - 0xe);
            switch(in_stack_ffffffffffffff50) {
            case (uint64_t *)0x0:
              pvVar8 = calloc(*(size_t *)(lVar2 + 0x98),1);
              *(void **)(in_RSI + 8) = pvVar8;
              if (*(long *)(in_RSI + 8) == 0) {
                return -1;
              }
              iVar5 = read_Bools(in_stack_ffffffffffffff68,(uchar *)in_stack_ffffffffffffff60,
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
              if (iVar5 < 0) {
                return -1;
              }
              local_5c = 0;
              for (local_54 = 0; (ulong)local_54 < *(ulong *)(lVar2 + 0x98); local_54 = local_54 + 1
                  ) {
                if (*(char *)(*(long *)(in_RSI + 8) + (ulong)local_54) != '\0') {
                  local_5c = local_5c + 1;
                }
              }
              goto LAB_00248e10;
            case (uint64_t *)0x1:
              if (local_5c < 1) {
                puVar7 = header_bytes(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
                if (puVar7 == (uchar *)0x0) {
                  return -1;
                }
              }
              else {
                pvVar8 = calloc((long)local_5c,1);
                *(void **)(in_RSI + 0x10) = pvVar8;
                if (*(long *)(in_RSI + 0x10) == 0) {
                  return -1;
                }
                iVar5 = read_Bools(in_stack_ffffffffffffff68,(uchar *)in_stack_ffffffffffffff60,
                                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
                if (iVar5 < 0) {
                  return -1;
                }
              }
              goto LAB_00248e10;
            case (uint64_t *)0x2:
              if (local_5c < 1) {
                puVar7 = header_bytes(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
                if (puVar7 == (uchar *)0x0) {
                  return -1;
                }
              }
              else {
                pvVar8 = calloc((long)local_5c,1);
                *(void **)(in_RSI + 0x18) = pvVar8;
                if (*(long *)(in_RSI + 0x18) == 0) {
                  return -1;
                }
                iVar5 = read_Bools(in_stack_ffffffffffffff68,(uchar *)in_stack_ffffffffffffff60,
                                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
                if (iVar5 < 0) {
                  return -1;
                }
              }
              goto LAB_00248e10;
            case (uint64_t *)0x3:
              paVar14 = in_stack_ffffffffffffff88;
              puVar7 = header_bytes(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
              if (puVar7 == (uchar *)0x0) {
                return -1;
              }
              a_00 = (archive_read *)
                     ((long)&in_stack_ffffffffffffff88[-1].cleanup_archive_extract + 7);
              if ((((ulong)a_00 & 1) != 0) ||
                 (a_00 < (archive_read *)(*(long *)(lVar2 + 0x98) << 2))) {
                return -1;
              }
              pvVar8 = malloc((size_t)a_00);
              *(void **)(lVar2 + 0xb0) = pvVar8;
              if (*(long *)(lVar2 + 0xb0) == 0) {
                return -1;
              }
              puVar7 = *(uchar **)(lVar2 + 0xb0);
              paVar13 = a_00;
              for (; a_00 != (archive_read *)0x0;
                  a_00 = (archive_read *)((long)a_00 - (long)in_stack_ffffffffffffff60)) {
                in_stack_ffffffffffffff60 = a_00;
                if ((archive_read *)0x10000 < a_00) {
                  in_stack_ffffffffffffff60 = (archive_read *)0x10000;
                }
                __src = header_bytes(a_00,(size_t)in_stack_ffffffffffffff60);
                if (__src == (uchar *)0x0) {
                  return -1;
                }
                memcpy(puVar7,__src,(size_t)in_stack_ffffffffffffff60);
                puVar7 = puVar7 + (long)&in_stack_ffffffffffffff60->archive;
              }
              in_stack_ffffffffffffff78 = *(archive_read **)(lVar2 + 0xb0);
              for (local_54 = 0; (ulong)local_54 < *(ulong *)(lVar2 + 0x98); local_54 = local_54 + 1
                  ) {
                *(archive_read **)(lVar3 + (ulong)local_54 * 0x58 + 8) = in_stack_ffffffffffffff78;
                while( true ) {
                  bVar12 = false;
                  if (((archive_read *)0x1 < paVar13) &&
                     (bVar12 = true, (char)(in_stack_ffffffffffffff78->archive).magic == '\0')) {
                    bVar12 = *(char *)((long)&(in_stack_ffffffffffffff78->archive).magic + 1) !=
                             '\0';
                  }
                  if (!bVar12) break;
                  in_stack_ffffffffffffff78 =
                       (archive_read *)((long)&(in_stack_ffffffffffffff78->archive).magic + 2);
                  paVar13 = (archive_read *)((long)&paVar13[-1].cleanup_archive_extract + 6);
                }
                if (paVar13 < (archive_read *)0x2) {
                  return -1;
                }
                *(long *)(lVar3 + (ulong)local_54 * 0x58) =
                     (long)in_stack_ffffffffffffff78 - *(long *)(lVar3 + (ulong)local_54 * 0x58 + 8)
                ;
                in_stack_ffffffffffffff78 =
                     (archive_read *)((long)&(in_stack_ffffffffffffff78->archive).magic + 2);
                paVar13 = (archive_read *)((long)&paVar13[-1].cleanup_archive_extract + 6);
              }
              in_stack_ffffffffffffff68 = (archive_read *)0x0;
              in_stack_ffffffffffffff88 = paVar14;
              goto LAB_00248e10;
            case (uint64_t *)0x4:
            case (uint64_t *)0x5:
            case (uint64_t *)0x6:
              iVar5 = read_Times(in_stack_ffffffffffffff88,
                                 (_7z_header_info *)in_stack_ffffffffffffff88,
                                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
              if (iVar5 < 0) {
                return -1;
              }
              goto LAB_00248e10;
            case (uint64_t *)0x7:
              pbVar9 = header_bytes(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
              if (pbVar9 == (byte *)0x0) {
                return -1;
              }
              in_stack_ffffffffffffff5c = (uint)*pbVar9;
              pvVar8 = calloc(*(size_t *)(lVar2 + 0x98),1);
              *(void **)(in_RSI + 0x20) = pvVar8;
              if (*(long *)(in_RSI + 0x20) == 0) {
                return -1;
              }
              if (in_stack_ffffffffffffff5c == 0) {
                iVar5 = read_Bools(in_stack_ffffffffffffff68,(uchar *)in_stack_ffffffffffffff60,
                                   (ulong)in_stack_ffffffffffffff58);
                if (iVar5 < 0) {
                  return -1;
                }
              }
              else {
                memset(*(void **)(in_RSI + 0x20),1,*(size_t *)(lVar2 + 0x98));
              }
              for (local_54 = 0; (ulong)local_54 < *(ulong *)(lVar2 + 0x98); local_54 = local_54 + 1
                  ) {
                if (*(char *)(*(long *)(in_RSI + 0x20) + (ulong)local_54) != '\0') {
                  puVar7 = header_bytes(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60)
                  ;
                  if (puVar7 == (uchar *)0x0) {
                    return -1;
                  }
                  uVar6 = archive_le32dec(puVar7);
                  *(uint32_t *)(lVar3 + (ulong)local_54 * 0x58 + 0x54) = uVar6;
                }
              }
              goto LAB_00248e10;
            }
            puVar7 = header_bytes(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
          } while (puVar7 != (uchar *)0x0);
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int
read_Header(struct archive_read *a, struct _7z_header_info *h,
    int check_header_id)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	struct _7z_folder *folders;
	struct _7z_stream_info *si = &(zip->si);
	struct _7zip_entry *entries;
	uint32_t folderIndex, indexInFolder;
	unsigned i;
	int eindex, empty_streams, sindex;

	if (check_header_id) {
		/*
		 * Read Header.
		 */
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		if (*p != kHeader)
			return (-1);
	}

	/*
	 * Read ArchiveProperties.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kArchiveProperties) {
		for (;;) {
			uint64_t size;
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			if (*p == 0)
				break;
			if (parse_7zip_uint64(a, &size) < 0)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 * Read MainStreamsInfo.
	 */
	if (*p == kMainStreamsInfo) {
		if (read_StreamsInfo(a, &(zip->si)) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kEnd)
		return (0);

	/*
	 * Read FilesInfo.
	 */
	if (*p != kFilesInfo)
		return (-1);

	if (parse_7zip_uint64(a, &(zip->numFiles)) < 0)
		return (-1);
	if (1000000 < zip->numFiles)
			return (-1);

	zip->entries = calloc((size_t)zip->numFiles, sizeof(*zip->entries));
	if (zip->entries == NULL)
		return (-1);
	entries = zip->entries;

	empty_streams = 0;
	for (;;) {
		int type;
		uint64_t size;
		size_t ll;

		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		type = *p;
		if (type == kEnd)
			break;

		if (parse_7zip_uint64(a, &size) < 0)
			return (-1);
		if (zip->header_bytes_remaining < size)
			return (-1);
		ll = (size_t)size;

		switch (type) {
		case kEmptyStream:
			h->emptyStreamBools = calloc((size_t)zip->numFiles,
			    sizeof(*h->emptyStreamBools));
			if (h->emptyStreamBools == NULL)
				return (-1);
			if (read_Bools(
			    a, h->emptyStreamBools, (size_t)zip->numFiles) < 0)
				return (-1);
			empty_streams = 0;
			for (i = 0; i < zip->numFiles; i++) {
				if (h->emptyStreamBools[i])
					empty_streams++;
			}
			break;
		case kEmptyFile:
			if (empty_streams <= 0) {
				/* Unexcepted sequence. Skip this. */
				if (header_bytes(a, ll) == NULL)
					return (-1);
				break;
			}
			h->emptyFileBools = calloc(empty_streams,
			    sizeof(*h->emptyFileBools));
			if (h->emptyFileBools == NULL)
				return (-1);
			if (read_Bools(a, h->emptyFileBools, empty_streams) < 0)
				return (-1);
			break;
		case kAnti:
			if (empty_streams <= 0) {
				/* Unexcepted sequence. Skip this. */
				if (header_bytes(a, ll) == NULL)
					return (-1);
				break;
			}
			h->antiBools = calloc(empty_streams,
			    sizeof(*h->antiBools));
			if (h->antiBools == NULL)
				return (-1);
			if (read_Bools(a, h->antiBools, empty_streams) < 0)
				return (-1);
			break;
		case kCTime:
		case kATime:
		case kMTime:
			if (read_Times(a, h, type) < 0)
				return (-1);
			break;
		case kName:
		{
			unsigned char *np;
			size_t nl, nb;

			/* Skip one byte. */
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			ll--;

			if ((ll & 1) || ll < zip->numFiles * 4)
				return (-1);

			zip->entry_names = malloc(ll);
			if (zip->entry_names == NULL)
				return (-1);
			np = zip->entry_names;
			nb = ll;
			/*
			 * Copy whole file names.
			 * NOTE: This loop prevents from expanding
			 * the uncompressed buffer in order not to
			 * use extra memory resource.
			 */
			while (nb) {
				size_t b;
				if (nb > UBUFF_SIZE)
					b = UBUFF_SIZE;
				else
					b = nb;
				if ((p = header_bytes(a, b)) == NULL)
					return (-1);
				memcpy(np, p, b);
				np += b;
				nb -= b;
			}
			np = zip->entry_names;
			nl = ll;

			for (i = 0; i < zip->numFiles; i++) {
				entries[i].utf16name = np;
#if defined(_WIN32) && !defined(__CYGWIN__) && defined(_DEBUG)
				entries[i].wname = (wchar_t *)np;
#endif

				/* Find a terminator. */
				while (nl >= 2 && (np[0] || np[1])) {
					np += 2;
					nl -= 2;
				}
				if (nl < 2)
					return (-1);/* Terminator not found */
				entries[i].name_len = np - entries[i].utf16name;
				np += 2;
				nl -= 2;
			}
			break;
		}
		case kAttributes:
		{
			int allAreDefined;

			if ((p = header_bytes(a, 2)) == NULL)
				return (-1);
			allAreDefined = *p;
			h->attrBools = calloc((size_t)zip->numFiles,
			    sizeof(*h->attrBools));
			if (h->attrBools == NULL)
				return (-1);
			if (allAreDefined)
				memset(h->attrBools, 1, (size_t)zip->numFiles);
			else {
				if (read_Bools(a, h->attrBools,
				      (size_t)zip->numFiles) < 0)
					return (-1);
			}
			for (i = 0; i < zip->numFiles; i++) {
				if (h->attrBools[i]) {
					if ((p = header_bytes(a, 4)) == NULL)
						return (-1);
					entries[i].attr = archive_le32dec(p);
				}
			}
			break;
		}
		default:
			if (header_bytes(a, ll) == NULL)
				return (-1);
			break;
		}
	}

	/*
	 * Set up entry's attributes.
	 */
	folders = si->ci.folders;
	eindex = sindex = 0;
	folderIndex = indexInFolder = 0;
	for (i = 0; i < zip->numFiles; i++) {
		if (h->emptyStreamBools == NULL || h->emptyStreamBools[i] == 0)
			entries[i].flg |= HAS_STREAM;
		/* The high 16 bits of attributes is a posix file mode. */
		entries[i].mode = entries[i].attr >> 16;
		if (entries[i].flg & HAS_STREAM) {
			if ((size_t)sindex >= si->ss.unpack_streams)
				return (-1);
			if (entries[i].mode == 0)
				entries[i].mode = AE_IFREG | 0666;
			if (si->ss.digestsDefined[sindex])
				entries[i].flg |= CRC32_IS_SET;
			entries[i].ssIndex = sindex;
			sindex++;
		} else {
			int dir;
			if (h->emptyFileBools == NULL)
				dir = 1;
			else {
				if (h->emptyFileBools[eindex])
					dir = 0;
				else
					dir = 1;
				eindex++;
			}
			if (entries[i].mode == 0) {
				if (dir)
					entries[i].mode = AE_IFDIR | 0777;
				else
					entries[i].mode = AE_IFREG | 0666;
			} else if (dir &&
			    (entries[i].mode & AE_IFMT) != AE_IFDIR) {
				entries[i].mode &= ~AE_IFMT;
				entries[i].mode |= AE_IFDIR;
			}
			if ((entries[i].mode & AE_IFMT) == AE_IFDIR &&
			    entries[i].name_len >= 2 &&
			    (entries[i].utf16name[entries[i].name_len-2] != '/' ||
			     entries[i].utf16name[entries[i].name_len-1] != 0)) {
				entries[i].utf16name[entries[i].name_len] = '/';
				entries[i].utf16name[entries[i].name_len+1] = 0;
				entries[i].name_len += 2;
			}
			entries[i].ssIndex = -1;
		}
		if (entries[i].attr & 0x01)
			entries[i].mode &= ~0222;/* Read only. */

		if ((entries[i].flg & HAS_STREAM) == 0 && indexInFolder == 0) {
			/*
			 * The entry is an empty file or a directory file,
			 * those both have no contents.
			 */
			entries[i].folderIndex = -1;
			continue;
		}
		if (indexInFolder == 0) {
			for (;;) {
				if (folderIndex >= si->ci.numFolders)
					return (-1);
				if (folders[folderIndex].numUnpackStreams)
					break;
				folderIndex++;
			}
		}
		entries[i].folderIndex = folderIndex;
		if ((entries[i].flg & HAS_STREAM) == 0)
			continue;
		indexInFolder++;
		if (indexInFolder >= folders[folderIndex].numUnpackStreams) {
			folderIndex++;
			indexInFolder = 0;
		}
	}

	return (0);
}